

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O2

int arkStep_NlsInit(ARKodeMem ark_mem)

{
  void *pvVar1;
  int iVar2;
  SUNNonlinearSolver_Type SVar3;
  ulong uVar4;
  undefined **ppuVar5;
  code *pcVar6;
  char *pcVar7;
  
  pvVar1 = ark_mem->step_mem;
  if (pvVar1 == (void *)0x0) {
    pcVar7 = "Time step module memory is NULL.";
    iVar2 = -0x15;
LAB_004c2e16:
    arkProcessError(ark_mem,iVar2,"ARKode::ARKStep","arkStep_NlsInit",pcVar7);
  }
  else {
    *(undefined8 *)((long)pvVar1 + 0x188) = 0;
    *(undefined8 *)((long)pvVar1 + 400) = 0;
    if (*(long *)((long)pvVar1 + 0x110) == 0) {
      pcVar6 = (SUNNonlinSolLSetupFn)0x0;
    }
    else {
      pcVar6 = arkStep_NlsLSetup;
    }
    iVar2 = SUNNonlinSolSetLSetupFn(*(SUNNonlinearSolver *)((long)pvVar1 + 0x78),pcVar6);
    if (iVar2 == 0) {
      if (*(long *)((long)pvVar1 + 0x118) == 0) {
        pcVar6 = (SUNNonlinSolLSolveFn)0x0;
      }
      else {
        pcVar6 = arkStep_NlsLSolve;
      }
      iVar2 = SUNNonlinSolSetLSolveFn(*(SUNNonlinearSolver *)((long)pvVar1 + 0x78),pcVar6);
      if (iVar2 == 0) {
        SVar3 = SUNNonlinSolGetType(*(SUNNonlinearSolver *)((long)pvVar1 + 0x78));
        if (SVar3 == SUNNONLINEARSOLVER_ROOTFIND) {
          uVar4 = (ulong)*(uint *)((long)pvVar1 + 0x168);
          if (uVar4 < 3) {
            ppuVar5 = &PTR_arkStep_NlsResidual_MassIdent_007d35c0;
            goto LAB_004c2eda;
          }
LAB_004c2f05:
          pcVar7 = "Invalid mass matrix type";
        }
        else {
          SVar3 = SUNNonlinSolGetType(*(SUNNonlinearSolver *)((long)pvVar1 + 0x78));
          if (SVar3 == SUNNONLINEARSOLVER_FIXEDPOINT) {
            uVar4 = (ulong)*(uint *)((long)pvVar1 + 0x168);
            if (2 < uVar4) goto LAB_004c2f05;
            ppuVar5 = &PTR_arkStep_NlsFPFunction_MassIdent_007d35d8;
LAB_004c2eda:
            iVar2 = SUNNonlinSolSetSysFn
                              (*(SUNNonlinearSolver *)((long)pvVar1 + 0x78),
                               (SUNNonlinSolSysFn)ppuVar5[uVar4]);
            if (iVar2 == 0) {
              iVar2 = SUNNonlinSolInitialize(*(SUNNonlinearSolver *)((long)pvVar1 + 0x78));
              if (iVar2 == 0) {
                return 0;
              }
              pcVar7 = "The nonlinear solver\'s init routine failed.";
              goto LAB_004c2e7e;
            }
            pcVar7 = "Setting nonlinear system function failed";
          }
          else {
            pcVar7 = "Invalid nonlinear solver type";
          }
        }
        iVar2 = -0x16;
        goto LAB_004c2e16;
      }
      pcVar7 = "Setting linear solver solve function failed";
    }
    else {
      pcVar7 = "Setting the linear solver setup function failed";
    }
LAB_004c2e7e:
    arkProcessError(ark_mem,-0x16,"ARKode::ARKStep","arkStep_NlsInit",pcVar7);
    iVar2 = -0x1d;
  }
  return iVar2;
}

Assistant:

int arkStep_NlsInit(ARKodeMem ark_mem)
{
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem==NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                    "arkStep_NlsInit", MSG_ARKSTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem) ark_mem->step_mem;

  /* reset counters */
  step_mem->nls_iters = 0;
  step_mem->nls_fails = 0;

  /* set the linear solver setup wrapper function */
  if (step_mem->lsetup)
    retval = SUNNonlinSolSetLSetupFn(step_mem->NLS, arkStep_NlsLSetup);
  else
    retval = SUNNonlinSolSetLSetupFn(step_mem->NLS, NULL);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                    "arkStep_NlsInit",
                    "Setting the linear solver setup function failed");
    return(ARK_NLS_INIT_FAIL);
  }

  /* set the linear solver solve wrapper function */
  if (step_mem->lsolve)
    retval = SUNNonlinSolSetLSolveFn(step_mem->NLS, arkStep_NlsLSolve);
  else
    retval = SUNNonlinSolSetLSolveFn(step_mem->NLS, NULL);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                    "arkStep_NlsInit",
                    "Setting linear solver solve function failed");
    return(ARK_NLS_INIT_FAIL);
  }

  /* set the nonlinear residual/fixed-point function, based on solver type */
  if (SUNNonlinSolGetType(step_mem->NLS) == SUNNONLINEARSOLVER_ROOTFIND) {
    if (step_mem->mass_type == MASS_IDENTITY) {
      retval = SUNNonlinSolSetSysFn(step_mem->NLS, arkStep_NlsResidual_MassIdent);
    } else if (step_mem->mass_type == MASS_FIXED) {
      retval = SUNNonlinSolSetSysFn(step_mem->NLS, arkStep_NlsResidual_MassFixed);
    } else if (step_mem->mass_type == MASS_TIMEDEP) {
      retval = SUNNonlinSolSetSysFn(step_mem->NLS, arkStep_NlsResidual_MassTDep);
    } else {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "arkStep_NlsInit",
                      "Invalid mass matrix type");
      return(ARK_ILL_INPUT);
    }
  } else if (SUNNonlinSolGetType(step_mem->NLS) ==  SUNNONLINEARSOLVER_FIXEDPOINT) {
    if (step_mem->mass_type == MASS_IDENTITY) {
      retval = SUNNonlinSolSetSysFn(step_mem->NLS, arkStep_NlsFPFunction_MassIdent);
    } else if (step_mem->mass_type == MASS_FIXED) {
      retval = SUNNonlinSolSetSysFn(step_mem->NLS, arkStep_NlsFPFunction_MassFixed);
    } else if (step_mem->mass_type == MASS_TIMEDEP) {
      retval = SUNNonlinSolSetSysFn(step_mem->NLS, arkStep_NlsFPFunction_MassTDep);
    } else {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "arkStep_NlsInit",
                      "Invalid mass matrix type");
      return(ARK_ILL_INPUT);
    }
  } else {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                    "arkStep_NlsInit",
                    "Invalid nonlinear solver type");
    return(ARK_ILL_INPUT);
  }
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                    "arkStep_NlsInit",
                    "Setting nonlinear system function failed");
    return(ARK_ILL_INPUT);
  }

  /* initialize nonlinear solver */
  retval = SUNNonlinSolInitialize(step_mem->NLS);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                    "arkStep_NlsInit", MSG_NLS_INIT_FAIL);
    return(ARK_NLS_INIT_FAIL);
  }

  return(ARK_SUCCESS);
}